

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editline.c
# Opt level: O1

el_status_t transpose(void)

{
  uchar c;
  long lVar1;
  
  if (rl_point != 0) {
    if (rl_point == rl_end) {
      left(CSmove);
    }
    c = rl_line_buffer[(long)rl_point + -1];
    left(CSstay);
    rl_line_buffer[(long)rl_point + -1] = rl_line_buffer[rl_point];
    tty_show(rl_line_buffer[(long)rl_point + -1]);
    lVar1 = (long)rl_point;
    rl_point = rl_point + 1;
    rl_line_buffer[lVar1] = c;
    tty_show(c);
  }
  return CSstay;
}

Assistant:

static el_status_t transpose(void)
{
    char        c;

    if (rl_point) {
        if (rl_point == rl_end)
            left(CSmove);
        c = rl_line_buffer[rl_point - 1];
        left(CSstay);
        rl_line_buffer[rl_point - 1] = rl_line_buffer[rl_point];
        tty_show(rl_line_buffer[rl_point - 1]);
        rl_line_buffer[rl_point++] = c;
        tty_show(c);
    }

    return CSstay;
}